

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O1

int __thiscall TinyProcessLib::Process::kill(Process *this,__pid_t __pid,int __sig)

{
  int iVar1;
  undefined8 uVar2;
  int __sig_00;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex);
  if (iVar1 == 0) {
    iVar1 = (this->data).id;
    if ((0 < iVar1) && (this->closed == false)) {
      __sig_00 = 2;
      if ((char)__pid != '\0') {
        __sig_00 = 0xf;
      }
      ::kill(-iVar1,__sig_00);
    }
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex);
    return iVar1;
  }
  uVar2 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar2);
}

Assistant:

void Process::kill(bool force) noexcept {
  std::lock_guard<std::mutex> lock(close_mutex);
  if(data.id > 0 && !closed) {
    if(force)
      ::kill(-data.id, SIGTERM);
    else
      ::kill(-data.id, SIGINT);
  }
}